

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

int Curl_cpool_check_limits(Curl_easy *data,connectdata *conn)

{
  Curl_share *pCVar1;
  Curl_multi *pCVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  Curl_llist *list;
  size_t sVar5;
  Curl_llist_node *n;
  connectdata *pcVar6;
  timediff_t tVar7;
  connectdata *pcVar8;
  ulong uVar9;
  cpool *cpool;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  curltime cVar13;
  curltime newer;
  curltime older;
  
  if (data == (Curl_easy *)0x0) {
    cpool = (cpool *)0x0;
  }
  else {
    pCVar1 = data->share;
    if ((pCVar1 == (Curl_share *)0x0) || ((pCVar1->specifier & 0x20) == 0)) {
      if (data->multi_easy == (Curl_multi *)0x0) {
        cpool = &data->multi->cpool;
        if (data->multi == (Curl_multi *)0x0) {
          cpool = (cpool *)0x0;
        }
      }
      else {
        cpool = &data->multi_easy->cpool;
      }
    }
    else {
      cpool = &pCVar1->cpool;
    }
  }
  if (cpool == (cpool *)0x0) {
    return 0;
  }
  if ((data == (Curl_easy *)0x0) || (pCVar2 = data->multi, pCVar2 == (Curl_multi *)0x0)) {
    uVar12 = 0;
    uVar9 = 0;
  }
  else {
    uVar12 = pCVar2->max_host_connections;
    uVar9 = pCVar2->max_total_connections;
  }
  if (uVar12 == 0 && uVar9 == 0) {
    return 0;
  }
  if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  cpool->field_0x98 = cpool->field_0x98 | 1;
  if (uVar12 == 0) {
LAB_00119afc:
    if (uVar9 == 0) {
      uVar10 = 0;
      goto LAB_00119b44;
    }
  }
  else {
    list = (Curl_llist *)Curl_hash_pick(&cpool->dest2bundle,conn->destination,conn->destination_len)
    ;
    while (list != (Curl_llist *)0x0) {
      sVar5 = Curl_llist_count(list);
      if (sVar5 < uVar12) goto LAB_00119ad2;
      cVar13 = Curl_now();
      n = Curl_llist_head(list);
      if (n == (Curl_llist_node *)0x0) {
        pcVar8 = (connectdata *)0x0;
      }
      else {
        lVar11 = -1;
        pcVar8 = (connectdata *)0x0;
        do {
          pcVar6 = (connectdata *)Curl_node_elem(n);
          sVar5 = Curl_llist_count(&pcVar6->easyq);
          if ((sVar5 == 0) &&
             (uVar3 = (pcVar6->lastused).tv_sec, uVar4 = (pcVar6->lastused).tv_usec,
             older.tv_usec = uVar4, older.tv_sec = uVar3, newer._12_4_ = 0,
             newer.tv_sec = SUB128(cVar13._0_12_,0), newer.tv_usec = SUB124(cVar13._0_12_,8),
             older._12_4_ = 0, tVar7 = Curl_timediff(newer,older), lVar11 < tVar7)) {
            lVar11 = tVar7;
            pcVar8 = pcVar6;
          }
          n = Curl_node_next(n);
        } while (n != (Curl_llist_node *)0x0);
      }
      if (pcVar8 == (connectdata *)0x0) goto LAB_00119ad2;
      Curl_cpool_disconnect(data,pcVar8,false);
      list = (Curl_llist *)
             Curl_hash_pick(&cpool->dest2bundle,conn->destination,conn->destination_len);
    }
    list = (Curl_llist *)0x0;
LAB_00119ad2:
    if (list == (Curl_llist *)0x0) goto LAB_00119afc;
    sVar5 = Curl_llist_count(list);
    uVar10 = (uint)(uVar12 <= sVar5);
    if ((uVar12 <= sVar5) || (uVar9 == 0)) goto LAB_00119b44;
  }
  uVar12 = cpool->num_conn;
  while ((uVar9 <= uVar12 && (pcVar8 = cpool_get_oldest_idle(cpool), pcVar8 != (connectdata *)0x0)))
  {
    Curl_cpool_disconnect(data,pcVar8,false);
    uVar12 = cpool->num_conn;
  }
  uVar10 = (uint)(uVar9 <= cpool->num_conn) * 2;
LAB_00119b44:
  cpool->field_0x98 = cpool->field_0x98 & 0xfe;
  if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
  }
  return uVar10;
}

Assistant:

int Curl_cpool_check_limits(struct Curl_easy *data,
                            struct connectdata *conn)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_bundle *bundle;
  size_t dest_limit = 0;
  size_t total_limit = 0;
  int result = CPOOL_LIMIT_OK;

  if(!cpool)
    return CPOOL_LIMIT_OK;

  if(data && data->multi) {
    dest_limit = data->multi->max_host_connections;
    total_limit = data->multi->max_total_connections;
  }

  if(!dest_limit && !total_limit)
    return CPOOL_LIMIT_OK;

  CPOOL_LOCK(cpool);
  if(dest_limit) {
    bundle = cpool_find_bundle(cpool, conn);
    while(bundle && (Curl_llist_count(&bundle->conns) >= dest_limit)) {
      struct connectdata *oldest_idle = NULL;
      /* The bundle is full. Extract the oldest connection that may
       * be removed now, if there is one. */
      oldest_idle = cpool_bundle_get_oldest_idle(bundle);
      if(!oldest_idle)
        break;
      /* disconnect the old conn and continue */
      DEBUGF(infof(data, "Discarding connection #%"
                   FMT_OFF_T " from %zu to reach destination "
                   "limit of %zu", oldest_idle->connection_id,
                   Curl_llist_count(&bundle->conns), dest_limit));
      Curl_cpool_disconnect(data, oldest_idle, FALSE);

      /* in case the bundle was destroyed in disconnect, look it up again */
      bundle = cpool_find_bundle(cpool, conn);
    }
    if(bundle && (Curl_llist_count(&bundle->conns) >= dest_limit)) {
      result = CPOOL_LIMIT_DEST;
      goto out;
    }
  }

  if(total_limit) {
    while(cpool->num_conn >= total_limit) {
      struct connectdata *oldest_idle = cpool_get_oldest_idle(cpool);
      if(!oldest_idle)
        break;
      /* disconnect the old conn and continue */
      DEBUGF(infof(data, "Discarding connection #%"
                   FMT_OFF_T " from %zu to reach total "
                   "limit of %zu",
                   oldest_idle->connection_id, cpool->num_conn, total_limit));
      Curl_cpool_disconnect(data, oldest_idle, FALSE);
    }
    if(cpool->num_conn >= total_limit) {
      result = CPOOL_LIMIT_TOTAL;
      goto out;
    }
  }

out:
  CPOOL_UNLOCK(cpool);
  return result;
}